

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDF::getRoot(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  bool bVar2;
  QPDFExc *__return_storage_ptr__;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  QPDF *in_RSI;
  QPDFObjectHandle QVar4;
  allocator<char> local_e2;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  QPDFExc local_a0;
  
  _Var1._M_head_impl =
       (in_RSI->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"/Root",(allocator<char> *)&local_e0);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)&(_Var1._M_head_impl)->trailer);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
  if (bVar2) {
    _Var3._M_pi = extraout_RDX;
    if (((in_RSI->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->check_mode == true) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"/Type",&local_e2);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_c0,(string *)this);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"/Catalog",&local_e1);
      bVar2 = QPDFObjectHandle::isNameAndEquals((QPDFObjectHandle *)&local_c0,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0._M_string_length);
      std::__cxx11::string::~string((string *)&local_a0);
      _Var3._M_pi = extraout_RDX_00;
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"catalog /Type entry missing or invalid",&local_e1);
        damagedPDF(&local_a0,in_RSI,&local_e0,-1,&local_c0);
        warn(in_RSI,&local_a0);
        QPDFExc::~QPDFExc(&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"/Type",(allocator<char> *)&local_c0);
        operator____qpdf((char *)&local_e0,0x20ec27);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)this,(string *)&local_a0,(QPDFObjectHandle *)&local_e0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e0._M_string_length);
        std::__cxx11::string::~string((string *)&local_a0);
        _Var3._M_pi = extraout_RDX_01;
      }
    }
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (QPDFObjectHandle)
           QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"unable to find /Root dictionary",&local_e2);
  damagedPDF(__return_storage_ptr__,in_RSI,(string *)&local_a0,-1,&local_e0);
  __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFObjectHandle
QPDF::getRoot()
{
    QPDFObjectHandle root = m->trailer.getKey("/Root");
    if (!root.isDictionary()) {
        throw damagedPDF("", -1, "unable to find /Root dictionary");
    } else if (
        // Check_mode is an interim solution to request #810 pending a more comprehensive review of
        // the approach to more extensive checks and warning levels.
        m->check_mode && !root.getKey("/Type").isNameAndEquals("/Catalog")) {
        warn(damagedPDF("", -1, "catalog /Type entry missing or invalid"));
        root.replaceKey("/Type", "/Catalog"_qpdf);
    }
    return root;
}